

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall cmGeneratorTarget::CheckCxxModuleStatus(cmGeneratorTarget *this,string *config)

{
  cmSourceFile *this_00;
  cmGlobalGenerator *pcVar1;
  cmMakefile *this_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Cxx20SupportLevel CVar5;
  string *psVar6;
  pointer pBVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string effStandard;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> sources;
  cmStandardLevelResolver standardResolver;
  string local_150;
  long *local_130;
  undefined8 local_128;
  long local_120 [2];
  cmGeneratorTarget *local_110;
  string *local_108;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> local_100;
  BT<cmSourceFile_*> local_e8;
  string local_c0;
  pointer local_a0;
  undefined8 local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  long *local_70;
  long **local_68;
  undefined8 local_60;
  BT<cmSourceFile_*> *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  bVar2 = HaveCxx20ModuleSources(this,(string *)0x0);
  if (!bVar2) {
    local_108 = config;
    GetSourceFiles(&local_100,this,config);
    if (local_100.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_100.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pBVar7 = local_100.
               super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_110 = this;
      do {
        this_00 = pBVar7->Value;
        cmSourceFile::GetLanguage_abi_cxx11_(&local_c0,this_00);
        if (((local_c0._M_string_length == 3) &&
            (iVar4 = bcmp(local_c0._M_dataplus._M_p,"CXX",3), iVar4 == 0)) &&
           (bVar3 = NeedDyndepForSource(local_110,&local_c0,local_108,this_00), bVar3)) {
          bVar2 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        pBVar7 = pBVar7 + 1;
        this = local_110;
      } while (pBVar7 != local_100.
                         super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::~vector(&local_100);
    config = local_108;
  }
  if (bVar2 != false) {
    pcVar1 = this->LocalGenerator->GlobalGenerator;
    iVar4 = (*pcVar1->_vptr_cmGlobalGenerator[0xe])(pcVar1,0);
    if ((char)iVar4 != '\0') {
      CVar5 = HaveCxxModuleSupport(this,config);
      (*(code *)(&DAT_0097df20 + *(int *)(&DAT_0097df20 + (ulong)CVar5 * 4)))();
      return;
    }
    this_01 = this->Makefile;
    psVar6 = cmTarget::GetName_abi_cxx11_(this->Target);
    (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_130);
    local_c0._M_dataplus._M_p = (pointer)0x12;
    local_c0._M_string_length = 0x97fa80;
    local_c0.field_2._M_allocated_capacity = 0;
    local_a0 = (psVar6->_M_dataplus)._M_p;
    local_c0.field_2._8_8_ = psVar6->_M_string_length;
    local_98 = 0;
    local_90 = 0x5b;
    local_88 = 
    "\" has C++ sources that may use modules, but modules are not supported by this generator:\n  ";
    local_80 = 0;
    local_78 = local_128;
    local_70 = local_130;
    local_100.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &local_e8;
    local_100.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
    local_e8.Value._0_1_ = 10;
    local_60 = 1;
    local_50 = 0;
    local_48 = 0xe9;
    local_40 = 
    "Modules are supported only by Ninja, Ninja Multi-Config, and Visual Studio generators for VS 17.4 and newer.  See the cmake-cxxmodules(7) manual for details.  Use the CMAKE_CXX_SCAN_FOR_MODULES variable to enable or disable scanning."
    ;
    local_38 = 0;
    views._M_len = 6;
    views._M_array = (iterator)&local_c0;
    local_68 = &local_130;
    local_58 = local_100.
               super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    cmCatViews(&local_150,views);
    cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_130 != local_120) {
      operator_delete(local_130,local_120[0] + 1);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::CheckCxxModuleStatus(std::string const& config) const
{
  bool haveScannableSources = false;

  // Check for `CXX_MODULE*` file sets and a lack of support.
  if (this->HaveCxx20ModuleSources()) {
    haveScannableSources = true;
  }

  if (!haveScannableSources) {
    // Check to see if there are regular sources that have requested scanning.
    auto sources = this->GetSourceFiles(config);
    for (auto const& source : sources) {
      auto const* sf = source.Value;
      auto const& lang = sf->GetLanguage();
      if (lang != "CXX"_s) {
        continue;
      }
      // Ignore sources which do not need dyndep.
      if (this->NeedDyndepForSource(lang, config, sf)) {
        haveScannableSources = true;
      }
    }
  }

  // If there isn't anything scannable, ignore it.
  if (!haveScannableSources) {
    return;
  }

  // If the generator doesn't support modules at all, error that we have
  // sources that require the support.
  if (!this->GetGlobalGenerator()->CheckCxxModuleSupport(
        cmGlobalGenerator::CxxModuleSupportQuery::Expected)) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("The target named \"", this->GetName(),
               "\" has C++ sources that may use modules, but modules are not "
               "supported by this generator:\n  ",
               this->GetGlobalGenerator()->GetName(), '\n',
               "Modules are supported only by Ninja, Ninja Multi-Config, "
               "and Visual Studio generators for VS 17.4 and newer.  "
               "See the cmake-cxxmodules(7) manual for details.  "
               "Use the CMAKE_CXX_SCAN_FOR_MODULES variable to enable or "
               "disable scanning."));
    return;
  }

  switch (this->HaveCxxModuleSupport(config)) {
    case cmGeneratorTarget::Cxx20SupportLevel::MissingCxx:
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("The target named \"", this->GetName(),
                 "\" has C++ sources that use modules, but the \"CXX\" "
                 "language has not been enabled."));
      break;
    case cmGeneratorTarget::Cxx20SupportLevel::NoCxx20: {
      cmStandardLevelResolver standardResolver(this->Makefile);
      auto effStandard =
        standardResolver.GetEffectiveStandard(this, "CXX", config);
      if (effStandard.empty()) {
        effStandard = "; no C++ standard found";
      } else {
        effStandard = cmStrCat("; found \"cxx_std_", effStandard, '"');
      }
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(
          "The target named \"", this->GetName(),
          "\" has C++ sources that use modules, but does not include "
          "\"cxx_std_20\" (or newer) among its `target_compile_features`",
          effStandard, '.'));
    } break;
    case cmGeneratorTarget::Cxx20SupportLevel::MissingRule: {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("The target named \"", this->GetName(),
                 "\" has C++ sources that may use modules, but the compiler "
                 "does not provide a way to discover the import graph "
                 "dependencies.  See the cmake-cxxmodules(7) manual for "
                 "details.  Use the CMAKE_CXX_SCAN_FOR_MODULES variable to "
                 "enable or disable scanning."));
    } break;
    case cmGeneratorTarget::Cxx20SupportLevel::Supported:
      // All is well.
      break;
  }
}